

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::ContainsKey(BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *this,uint *key)

{
  int *piVar1;
  SimpleDictionaryEntry<unsigned_int,_Js::IndexPropertyDescriptor> *pSVar2;
  uint uVar3;
  Type this_00;
  uint uVar4;
  
  piVar1 = (this->buckets).ptr;
  uVar3 = 0;
  if (piVar1 != (int *)0x0) {
    uVar3 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar4 = piVar1[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar4) {
      pSVar2 = (this->entries).ptr;
      uVar3 = 0;
      do {
        if (pSVar2[uVar4].
            super_DefaultHashedEntry<unsigned_int,_Js::IndexPropertyDescriptor,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_Js::IndexPropertyDescriptor>.
            super_ValueEntry<Js::IndexPropertyDescriptor,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::IndexPropertyDescriptor>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_Js::IndexPropertyDescriptor>.key == *key)
        {
          this_00 = this->stats;
          goto LAB_00dba04c;
        }
        uVar3 = uVar3 + 1;
        uVar4 = pSVar2[uVar4].
                super_DefaultHashedEntry<unsigned_int,_Js::IndexPropertyDescriptor,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Js::IndexPropertyDescriptor>.
                super_ValueEntry<Js::IndexPropertyDescriptor,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::IndexPropertyDescriptor>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_Js::IndexPropertyDescriptor>.next;
      } while (-1 < (int)uVar4);
    }
  }
  this_00 = this->stats;
  uVar4 = 0xffffffff;
LAB_00dba04c:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  return -1 < (int)uVar4;
}

Assistant:

bool ContainsKey(const TKey& key) const
        {
            return FindEntry(key) >= 0;
        }